

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_send_op.hpp
# Opt level: O2

bool asio::detail::reactive_socket_send_op_base<asio::const_buffers_1>::do_perform(reactor_op *base)

{
  bool bVar1;
  buffer_sequence_adapter<asio::const_buffer,_asio::const_buffers_1> bufs;
  
  bufs.buffer_.iov_base = base[1].super_operation.func_;
  bufs.buffer_.iov_len = *(size_t *)&base[1].super_operation.task_result_;
  bufs.total_buffer_size_ = bufs.buffer_.iov_len;
  bVar1 = socket_ops::non_blocking_send
                    (*(socket_type *)&base[1].super_operation.next_,&bufs.buffer_,1,
                     base[1].ec_._M_value,&base->ec_,&base->bytes_transferred_);
  return bVar1;
}

Assistant:

static bool do_perform(reactor_op* base)
  {
    reactive_socket_send_op_base* o(
        static_cast<reactive_socket_send_op_base*>(base));

    buffer_sequence_adapter<asio::const_buffer,
        ConstBufferSequence> bufs(o->buffers_);

    bool result = socket_ops::non_blocking_send(o->socket_,
          bufs.buffers(), bufs.count(), o->flags_,
          o->ec_, o->bytes_transferred_);

    ASIO_HANDLER_REACTOR_OPERATION((*o, "non_blocking_send",
          o->ec_, o->bytes_transferred_));

    return result;
  }